

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O1

int AF_DThinkerIterator_Create
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *cls;
  VMValue *pVVar1;
  DThinkerIterator *this;
  int iVar2;
  char *pcVar3;
  
  if (numparam < 1) {
    pVVar1 = defaultparam->Array;
    if (((pVVar1->field_0).field_3.Type != '\x03') ||
       (((pVVar1->field_0).field_1.atag != 1 && ((pVVar1->field_0).field_1.a != (void *)0x0)))) {
      pcVar3 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
      goto LAB_00381567;
    }
  }
  else if (((param->field_0).field_3.Type != '\x03') ||
          ((pVVar1 = param, (param->field_0).field_1.atag != 1 &&
           ((param->field_0).field_1.a != (void *)0x0)))) {
    pcVar3 = 
    "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
    ;
LAB_00381567:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                  ,0x2d1,
                  "int AF_DThinkerIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  cls = (PClass *)(pVVar1->field_0).field_1.a;
  if (numparam < 2) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type == '\0') goto LAB_003814e9;
    pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') {
LAB_003814e9:
      iVar2 = param[1].field_0.i;
      this = (DThinkerIterator *)
             M_Malloc_Dbg(0x40,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                          ,0x1f9);
      DThinkerIterator::DThinkerIterator(this,cls,iVar2);
      if (numret < 1) {
        iVar2 = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                        ,0x2d3,
                        "int AF_DThinkerIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        iVar2 = 1;
        VMReturn::SetPointer(ret,this,1);
      }
      return iVar2;
    }
    pcVar3 = "(param[paramnum]).Type == REGT_INT";
  }
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                ,0x2d2,
                "int AF_DThinkerIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(DThinkerIterator, Create)
{
	PARAM_PROLOGUE;
	PARAM_CLASS_DEF(type, DThinker);
	PARAM_INT_DEF(statnum);
	ACTION_RETURN_OBJECT(new DThinkerIterator(type, statnum));
}